

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFloatFormat.cpp
# Opt level: O2

double __thiscall
tcu::FloatFormat::roundOut(FloatFormat *this,double d,bool upward,bool roundUnderOverflow)

{
  undefined3 in_register_00000011;
  double dVar1;
  int exp;
  int local_24;
  double local_20;
  
  local_24 = 0;
  local_20 = d;
  deFractExp(d,&local_24);
  if (((CONCAT31(in_register_00000011,roundUnderOverflow) == 0) || (0.0 <= local_20 == upward)) ||
     (local_24 <= this->m_maxExp)) {
    dVar1 = round(this,local_20);
  }
  else {
    dVar1 = deSign(local_20);
    dVar1 = dVar1 * this->m_maxValue;
  }
  return dVar1;
}

Assistant:

double FloatFormat::roundOut (double d, bool upward, bool roundUnderOverflow) const
{
	int	exp	= 0;
	deFractExp(d, &exp);

	if (roundUnderOverflow && exp > m_maxExp && (upward == (d < 0.0)))
		return deSign(d) * getMaxValue();
	else
		return round(d, upward);
}